

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_convolve_y_sr_intrabc_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = 0;
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = 0;
  }
  if (h < 1) {
    h = 0;
  }
  for (; iVar1 != h; iVar1 = iVar1 + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      dst[uVar3] = (uint8_t)((uint)src[uVar3] + (uint)(src + src_stride)[uVar3] + 1 >> 1);
    }
    dst = dst + dst_stride;
    src = src + src_stride;
  }
  return;
}

Assistant:

void av1_convolve_y_sr_intrabc_c(const uint8_t *src, int src_stride,
                                 uint8_t *dst, int dst_stride, int w, int h,
                                 const InterpFilterParams *filter_params_y,
                                 const int subpel_y_qn) {
  assert(subpel_y_qn == 8);
  assert(filter_params_y->taps == 2);
  (void)filter_params_y;
  (void)subpel_y_qn;

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t res = src[x] + src[src_stride + x];
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(res, 1));
    }
    src += src_stride;
    dst += dst_stride;
  }
}